

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_alloc(jit_State *J,RecordFFData *rd,CTypeID id)

{
  CTSize trlen;
  jit_State *d_00;
  RecordFFData *pRVar1;
  undefined2 uVar2;
  TRef TVar3;
  TRef TVar4;
  int iVar5;
  TRef local_360;
  TRef local_35c;
  TRef local_304;
  TRef local_300;
  TRef local_2fc;
  cTValue local_2f8;
  TValue tv_2;
  TValue *pTStack_2e8;
  TRef dp_3;
  TValue *sval_1;
  TValue tv_1;
  TRef dp_2;
  TRef sp_2;
  CType *dc_2;
  CType *df_1;
  CType *dc_1;
  CType *df;
  MSize i_1;
  CTypeID fid;
  TRef dp_1;
  MSize i;
  TValue *sval;
  TValue tv;
  CTSize local_288;
  TRef sp_1;
  CTSize esize;
  CTSize ofs;
  CType *dc;
  CTSize align;
  TRef dp;
  CTSize sz1;
  CTSize sz0;
  TRef trsz;
  TRef sp;
  cTValue *fin;
  TRef trid;
  TRef trcd;
  CType *d;
  CTInfo info;
  CTSize sz;
  CTState *cts;
  RecordFFData *pRStack_230;
  CTypeID id_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct;
  CTState *local_210;
  CType *local_208;
  CTState *local_200;
  CType *local_1f8;
  CTState *local_1f0;
  jit_State *local_1e8;
  CTState *local_1e0;
  undefined2 local_1d6;
  undefined2 local_1d4;
  undefined2 local_1d2;
  RecordFFData *local_1d0;
  undefined2 local_1c6;
  undefined2 local_1c4;
  undefined2 local_1c2;
  RecordFFData *local_1c0;
  undefined2 local_1b6;
  undefined2 local_1b4;
  undefined2 local_1b2;
  RecordFFData *local_1b0;
  undefined2 local_1a6;
  undefined2 local_1a4;
  undefined2 local_1a2;
  RecordFFData *local_1a0;
  undefined2 local_196;
  undefined2 local_194;
  undefined2 local_192;
  RecordFFData *local_190;
  undefined2 local_186;
  undefined2 local_184;
  undefined2 local_182;
  RecordFFData *local_180;
  undefined2 local_176;
  undefined2 local_174;
  undefined2 local_172;
  RecordFFData *local_170;
  undefined2 local_166;
  undefined2 local_164;
  undefined2 local_162;
  RecordFFData *local_160;
  jit_State *local_158;
  CTState *local_150;
  CType *local_148;
  CTState *local_140;
  CType *local_138;
  CTState *local_130;
  jit_State *local_128;
  CTState *local_120;
  uint local_114;
  CTState *local_110;
  uint local_104;
  CTState *local_100;
  uint local_f4;
  CTState *local_f0;
  uint local_e4;
  CTState *local_e0;
  uint local_d4;
  CTState *local_d0;
  uint local_c4;
  CTState *local_c0;
  uint local_b4;
  CTState *local_b0;
  undefined4 local_a4;
  CTState *local_a0;
  undefined4 local_94;
  CTState *local_90;
  uint local_84;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  uint local_64;
  CTState *local_60;
  uint local_54;
  CTState *local_50;
  uint local_44;
  CTState *local_40;
  uint local_34;
  CTState *local_30;
  uint local_24;
  CTState *local_20;
  undefined4 local_14;
  TValue **local_10;
  
  _info = *(CTState **)&J[-1].penalty[0x3c].val;
  cts._4_4_ = id;
  pRStack_230 = rd;
  rd_local = (RecordFFData *)J;
  d._0_4_ = lj_ctype_info(_info,id,(CTSize *)((long)&d + 4));
  local_210 = _info;
  ct._4_4_ = cts._4_4_;
  local_d0 = _info;
  local_d4 = cts._4_4_;
  local_60 = _info;
  local_64 = cts._4_4_;
  J_local = (jit_State *)(_info->tab + cts._4_4_);
  while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
    local_120 = _info;
    local_128 = J_local;
    local_110 = _info;
    local_114 = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
    local_20 = _info;
    J_local = (jit_State *)(_info->tab + local_114);
    local_24 = local_114;
  }
  _trid = J_local;
  fin._0_4_ = lj_ir_kint((jit_State *)rd_local,cts._4_4_);
  if (((CTInfo)d >> 0x1c == 2) ||
     ((((CTInfo)d & 0xfc000000) == 0 && ((d._4_4_ == 4 || (d._4_4_ == 8)))))) {
    if (*(int *)(*(long *)&rd_local[6].data + 4) == 0) {
      if ((CTInfo)d >> 0x1c == 2) {
        local_300 = lj_ir_kptr_((jit_State *)rd_local,IR_KPTR,(void *)0x0);
      }
      else {
        if (d._4_4_ == 4) {
          local_304 = lj_ir_kint((jit_State *)rd_local,0);
        }
        else {
          local_304 = lj_ir_kint64((jit_State *)rd_local,0);
        }
        local_300 = local_304;
      }
      local_2fc = local_300;
    }
    else {
      local_2fc = crec_ct_tv((jit_State *)rd_local,(CType *)_trid,0,
                             *(TRef *)(*(long *)&rd_local[6].data + 4),pRStack_230->argv + 1);
    }
    sz0 = local_2fc;
    local_164 = (undefined2)(TRef)fin;
    local_160 = rd_local;
    local_162 = 0x548a;
    local_166 = (undefined2)local_2fc;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x548a;
    *(undefined2 *)&rd_local[7].data = local_164;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_166;
    TVar3 = lj_opt_fold((jit_State *)rd_local);
    **(TRef **)&rd_local[6].data = TVar3;
    return;
  }
  sz1 = 0x7fff;
  if (((CTInfo)d & 0x100000) == 0) {
    if (3 < ((CTInfo)d >> 0x10 & 0xf)) {
      sz1 = lj_ir_kint((jit_State *)rd_local,d._4_4_);
    }
  }
  else {
    if ((*(int *)(*(long *)&rd_local[6].data + 4) == 0) ||
       (*(int *)(*(long *)&rd_local[6].data + 8) != 0)) {
      lj_trace_err((jit_State *)rd_local,LJ_TRERR_NYICONV);
    }
    local_a0 = _info;
    local_a4 = 9;
    local_90 = _info;
    local_94 = 9;
    sz1 = crec_ct_tv((jit_State *)rd_local,_info->tab + 9,0,
                     *(TRef *)(*(long *)&rd_local[6].data + 4),pRStack_230->argv + 1);
    dp = lj_ctype_vlsize(_info,(CType *)_trid,0);
    align = lj_ctype_vlsize(_info,(CType *)_trid,1);
    pRVar1 = rd_local;
    uVar2 = (undefined2)sz1;
    TVar3 = lj_ir_kint((jit_State *)rd_local,align - dp);
    local_170 = pRVar1;
    local_172 = 0x3793;
    local_176 = (undefined2)TVar3;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x3793;
    *(undefined2 *)&pRVar1[7].data = uVar2;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_176;
    local_174 = uVar2;
    sz1 = lj_opt_fold((jit_State *)rd_local);
    pRVar1 = rd_local;
    uVar2 = (undefined2)sz1;
    TVar3 = lj_ir_kint((jit_State *)rd_local,dp);
    local_180 = pRVar1;
    local_182 = 0x3593;
    local_186 = (undefined2)TVar3;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x3593;
    *(undefined2 *)&pRVar1[7].data = uVar2;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_186;
    local_184 = uVar2;
    sz1 = lj_opt_fold((jit_State *)rd_local);
    *(undefined4 *)(*(long *)&rd_local[6].data + 4) = 0;
  }
  local_194 = (undefined2)(TRef)fin;
  local_190 = rd_local;
  local_192 = 0x538a;
  local_196 = (undefined2)sz1;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x538a;
  *(undefined2 *)&rd_local[7].data = local_194;
  *(undefined2 *)((long)&rd_local[7].data + 2) = local_196;
  fin._4_4_ = lj_opt_fold((jit_State *)rd_local);
  if ((d._4_4_ < 0x81) && (((CTInfo)d & 0x100000) == 0)) {
    if ((*(int *)(*(long *)&rd_local[6].data + 4) != 0) &&
       ((*(int *)(*(long *)&rd_local[6].data + 8) == 0 &&
        (iVar5 = lj_cconv_multi_init(_info,(CType *)_trid,pRStack_230->argv + 1), iVar5 == 0)))) {
LAB_001b5b87:
      pRVar1 = rd_local;
      uVar2 = (undefined2)fin._4_4_;
      TVar3 = lj_ir_kint64((jit_State *)rd_local,0x10);
      local_1d0 = pRVar1;
      local_1d2 = 0x2909;
      local_1d6 = (undefined2)TVar3;
      *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
      *(undefined2 *)&pRVar1[7].data = uVar2;
      *(undefined2 *)((long)&pRVar1[7].data + 2) = local_1d6;
      local_1d4 = uVar2;
      TVar3 = lj_opt_fold((jit_State *)rd_local);
      pRVar1 = rd_local;
      d_00 = _trid;
      tv_2.field_4.it = TVar3;
      if (*(int *)(*(long *)&rd_local[6].data + 4) == 0) {
        local_2f8.u64 = 0;
        TVar4 = lj_ir_kint((jit_State *)rd_local,0);
        crec_ct_tv((jit_State *)pRVar1,(CType *)d_00,TVar3,TVar4,&local_2f8);
      }
      else {
        crec_ct_tv((jit_State *)rd_local,(CType *)_trid,TVar3,
                   *(TRef *)(*(long *)&rd_local[6].data + 4),pRStack_230->argv + 1);
      }
      goto LAB_001b5ce9;
    }
    if ((uint)(_trid->cur).nextgc.gcptr64 >> 0x1c == 3) {
      local_1e0 = _info;
      local_1e8 = _trid;
      do {
        local_150 = _info;
        local_158 = local_1e8;
        local_e0 = _info;
        local_e4 = (uint)(local_1e8->cur).nextgc.gcptr64 & 0xffff;
        local_50 = _info;
        _esize = (jit_State *)(_info->tab + local_e4);
        local_1e8 = _esize;
      } while ((uint)(_esize->cur).nextgc.gcptr64 >> 0x1c == 8);
      local_288 = *(CTSize *)((long)&(_esize->cur).nextgc.gcptr64 + 4);
      tv.field_4.it = 0;
      _dp_1 = (cTValue *)&sval;
      sval = (TValue *)0x0;
      local_54 = local_e4;
      if ((((uint)(_esize->cur).nextgc.gcptr64 >> 0x1c == 0) ||
          ((uint)(_esize->cur).nextgc.gcptr64 >> 0x1c == 2)) && (d._4_4_ <= local_288 << 4)) {
        fid = 1;
        for (sp_1 = 0; pRVar1 = rd_local, sp_1 < d._4_4_; sp_1 = local_288 + sp_1) {
          uVar2 = (undefined2)fin._4_4_;
          TVar3 = lj_ir_kint64((jit_State *)rd_local,(ulong)sp_1 + 0x10);
          local_1b0 = pRVar1;
          local_1b2 = 0x2909;
          local_1b6 = (undefined2)TVar3;
          *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
          *(undefined2 *)&pRVar1[7].data = uVar2;
          *(undefined2 *)((long)&pRVar1[7].data + 2) = local_1b6;
          local_1b4 = uVar2;
          i_1 = lj_opt_fold((jit_State *)rd_local);
          if (*(int *)(*(long *)&rd_local[6].data + (ulong)fid * 4) == 0) {
            if (fid != 2) {
              if ((uint)(_esize->cur).nextgc.gcptr64 >> 0x1c == 0) {
                local_35c = lj_ir_kint((jit_State *)rd_local,0);
              }
              else {
                local_35c = 0x7fff;
              }
              tv.field_4.it = local_35c;
            }
          }
          else {
            tv.field_4.it = *(uint32_t *)(*(long *)&rd_local[6].data + (ulong)fid * 4);
            _dp_1 = pRStack_230->argv + fid;
            fid = fid + 1;
          }
          crec_ct_tv((jit_State *)rd_local,(CType *)_esize,i_1,tv.field_4.it,_dp_1);
        }
        goto LAB_001b5ce9;
      }
    }
    else {
      if ((uint)(_trid->cur).nextgc.gcptr64 >> 0x1c != 1) goto LAB_001b5b87;
      df._0_4_ = 1;
      if (*(int *)(*(long *)&rd_local[6].data + 4) != 0) {
LAB_001b57df:
        df._4_4_ = (uint)*(ushort *)&(_trid->cur).marked;
        while (df._4_4_ != 0) {
          local_c0 = _info;
          local_c4 = df._4_4_;
          local_70 = _info;
          local_74 = df._4_4_;
          dc_2 = _info->tab + df._4_4_;
          df._4_4_ = (uint)dc_2->sib;
          if (dc_2->info >> 0x1c == 9) {
            pTStack_2e8 = (TValue *)&sval_1;
            local_10 = &sval_1;
            local_14 = 0;
            sval_1 = (TValue *)0x0;
            if ((dc_2->name).gcptr64 != 0) {
              local_200 = _info;
              local_208 = dc_2;
              do {
                local_130 = _info;
                local_138 = local_208;
                local_104 = local_208->info & 0xffff;
                local_100 = _info;
                local_30 = _info;
                _dp_2 = _info->tab + local_104;
                local_208 = _dp_2;
              } while (_dp_2->info >> 0x1c == 8);
              local_34 = local_104;
              if (((_dp_2->info >> 0x1c != 0) && (_dp_2->info >> 0x1c != 2)) &&
                 (_dp_2->info >> 0x1c != 5)) {
                lj_trace_err((jit_State *)rd_local,LJ_TRERR_NYICONV);
              }
              if (*(int *)(*(long *)&rd_local[6].data + (ulong)(uint)df * 4) == 0) {
                if (_dp_2->info >> 0x1c == 2) {
                  local_360 = 0x7fff;
                }
                else {
                  local_360 = lj_ir_kint((jit_State *)rd_local,0);
                }
                tv_1.field_4.it = local_360;
              }
              else {
                tv_1.field_4.it = *(uint32_t *)(*(long *)&rd_local[6].data + (ulong)(uint)df * 4);
                pTStack_2e8 = pRStack_230->argv + (uint)df;
                df._0_4_ = (uint)df + 1;
              }
              pRVar1 = rd_local;
              uVar2 = (undefined2)fin._4_4_;
              TVar3 = lj_ir_kint64((jit_State *)rd_local,(ulong)dc_2->size + 0x10);
              local_1c0 = pRVar1;
              local_1c2 = 0x2909;
              local_1c6 = (undefined2)TVar3;
              *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
              *(undefined2 *)&pRVar1[7].data = uVar2;
              *(undefined2 *)((long)&pRVar1[7].data + 2) = local_1c6;
              local_1c4 = uVar2;
              tv_1.u32.lo = lj_opt_fold((jit_State *)rd_local);
              crec_ct_tv((jit_State *)rd_local,_dp_2,tv_1.u32.lo,tv_1.field_4.it,pTStack_2e8);
              if (((_trid->cur).nextgc.gcptr64 & 0x800000) != 0) {
                if (*(CTSize *)((long)&(_trid->cur).nextgc.gcptr64 + 4) != _dp_2->size) {
                  lj_trace_err((jit_State *)rd_local,LJ_TRERR_NYICONV);
                }
                break;
              }
            }
          }
          else if (dc_2->info >> 0x1c != 0xb) {
            lj_trace_err((jit_State *)rd_local,LJ_TRERR_NYICONV);
          }
        }
        goto LAB_001b5ce9;
      }
      df._4_4_ = (uint)*(ushort *)&(_trid->cur).marked;
      do {
        while( true ) {
          if (df._4_4_ == 0) goto LAB_001b57df;
          local_b0 = _info;
          local_b4 = df._4_4_;
          local_80 = _info;
          local_84 = df._4_4_;
          dc_1 = _info->tab + df._4_4_;
          df._4_4_ = (uint)dc_1->sib;
          if (dc_1->info >> 0x1c != 9) break;
          if ((dc_1->name).gcptr64 != 0) {
            local_1f0 = _info;
            local_1f8 = dc_1;
            do {
              local_140 = _info;
              local_148 = local_1f8;
              local_f0 = _info;
              local_f4 = local_1f8->info & 0xffff;
              local_40 = _info;
              df_1 = _info->tab + local_f4;
              local_1f8 = df_1;
            } while (df_1->info >> 0x1c == 8);
            local_44 = local_f4;
            if (((df_1->info >> 0x1c != 0) && (df_1->info >> 0x1c != 2)) &&
               (df_1->info >> 0x1c != 5)) goto LAB_001b513d;
          }
        }
      } while (dc_1->info >> 0x1c == 0xb);
    }
  }
LAB_001b513d:
  pRVar1 = rd_local;
  if (*(int *)(*(long *)&rd_local[6].data + 4) != 0) {
    lj_trace_err((jit_State *)rd_local,LJ_TRERR_NYICONV);
  }
  uVar2 = (undefined2)fin._4_4_;
  TVar3 = lj_ir_kint64((jit_State *)rd_local,0x10);
  local_1a0 = pRVar1;
  local_1a2 = 0x2909;
  local_1a6 = (undefined2)TVar3;
  *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
  *(undefined2 *)&pRVar1[7].data = uVar2;
  *(undefined2 *)((long)&pRVar1[7].data + 2) = local_1a6;
  local_1a4 = uVar2;
  dc._4_4_ = lj_opt_fold((jit_State *)rd_local);
  if (sz1 == 0x7fff) {
    sz1 = lj_ir_kint((jit_State *)rd_local,d._4_4_);
  }
  pRVar1 = rd_local;
  trlen = sz1;
  TVar3 = dc._4_4_;
  dc._0_4_ = (CTInfo)d >> 0x10 & 0xf;
  if ((uint)dc < 3) {
    dc._0_4_ = 3;
  }
  TVar4 = lj_ir_kint((jit_State *)rd_local,0);
  crec_fill((jit_State *)pRVar1,TVar3,trlen,TVar4,1 << ((byte)(uint)dc & 0x1f));
LAB_001b5ce9:
  **(TRef **)&rd_local[6].data = fin._4_4_;
  _trsz = lj_ctype_meta(_info,cts._4_4_,MM_gc);
  if (_trsz != (cTValue *)0x0) {
    crec_finalizer((jit_State *)rd_local,fin._4_4_,0,_trsz);
  }
  return;
}

Assistant:

static void crec_alloc(jit_State *J, RecordFFData *rd, CTypeID id)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  CType *d = ctype_raw(cts, id);
  TRef trcd, trid = lj_ir_kint(J, id);
  cTValue *fin;
  /* Use special instruction to box pointer or 32/64 bit integer. */
  if (ctype_isptr(info) || (ctype_isinteger(info) && (sz == 4 || sz == 8))) {
    TRef sp = J->base[1] ? crec_ct_tv(J, d, 0, J->base[1], &rd->argv[1]) :
	      ctype_isptr(info) ? lj_ir_kptr(J, NULL) :
	      sz == 4 ? lj_ir_kint(J, 0) :
	      (lj_needsplit(J), lj_ir_kint64(J, 0));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, sp);
    return;
  } else {
    TRef trsz = TREF_NIL;
    if ((info & CTF_VLA)) {  /* Calculate VLA/VLS size at runtime. */
      CTSize sz0, sz1;
      if (!J->base[1] || J->base[2])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init VLA/VLS. */
      trsz = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0,
			J->base[1], &rd->argv[1]);
      sz0 = lj_ctype_vlsize(cts, d, 0);
      sz1 = lj_ctype_vlsize(cts, d, 1);
      trsz = emitir(IRTGI(IR_MULOV), trsz, lj_ir_kint(J, (int32_t)(sz1-sz0)));
      trsz = emitir(IRTGI(IR_ADDOV), trsz, lj_ir_kint(J, (int32_t)sz0));
      J->base[1] = 0;  /* Simplify logic below. */
    } else if (ctype_align(info) > CT_MEMALIGN) {
      trsz = lj_ir_kint(J, sz);
    }
    trcd = emitir(IRTG(IR_CNEW, IRT_CDATA), trid, trsz);
    if (sz > 128 || (info & CTF_VLA)) {
      TRef dp;
      CTSize align;
    special:  /* Only handle bulk zero-fill for large/VLA/VLS types. */
      if (J->base[1])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init large/VLA/VLS types. */
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (trsz == TREF_NIL) trsz = lj_ir_kint(J, sz);
      align = ctype_align(info);
      if (align < CT_MEMALIGN) align = CT_MEMALIGN;
      crec_fill(J, dp, trsz, lj_ir_kint(J, 0), (1u << align));
    } else if (J->base[1] && !J->base[2] &&
	!lj_cconv_multi_init(cts, d, &rd->argv[1])) {
      goto single_init;
    } else if (ctype_isarray(d->info)) {
      CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
      CTSize ofs, esize = dc->size;
      TRef sp = 0;
      TValue tv;
      TValue *sval = &tv;
      MSize i;
      tv.u64 = 0;
      if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info)) ||
	  esize * CREC_FILL_MAXUNROLL < sz)
	goto special;
      for (i = 1, ofs = 0; ofs < sz; ofs += esize) {
	TRef dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
			 lj_ir_kintp(J, ofs + sizeof(GCcdata)));
	if (J->base[i]) {
	  sp = J->base[i];
	  sval = &rd->argv[i];
	  i++;
	} else if (i != 2) {
	  sp = ctype_isnum(dc->info) ? lj_ir_kint(J, 0) : TREF_NIL;
	}
	crec_ct_tv(J, dc, dp, sp, sval);
      }
    } else if (ctype_isstruct(d->info)) {
      CTypeID fid;
      MSize i = 1;
      if (!J->base[1]) {  /* Handle zero-fill of struct-of-NYI. */
	fid = d->sib;
	while (fid) {
	  CType *df = ctype_get(cts, fid);
	  fid = df->sib;
	  if (ctype_isfield(df->info)) {
	    CType *dc;
	    if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	    dc = ctype_rawchild(cts, df);  /* Field type. */
	    if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		  ctype_isenum(dc->info)))
	      goto special;
	  } else if (!ctype_isconstval(df->info)) {
	    goto special;
	  }
	}
      }
      fid = d->sib;
      while (fid) {
	CType *df = ctype_get(cts, fid);
	fid = df->sib;
	if (ctype_isfield(df->info)) {
	  CType *dc;
	  TRef sp, dp;
	  TValue tv;
	  TValue *sval = &tv;
	  setintV(&tv, 0);
	  if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	  dc = ctype_rawchild(cts, df);  /* Field type. */
	  if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		ctype_isenum(dc->info)))
	    lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init aggregates. */
	  if (J->base[i]) {
	    sp = J->base[i];
	    sval = &rd->argv[i];
	    i++;
	  } else {
	    sp = ctype_isptr(dc->info) ? TREF_NIL : lj_ir_kint(J, 0);
	  }
	  dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
		      lj_ir_kintp(J, df->size + sizeof(GCcdata)));
	  crec_ct_tv(J, dc, dp, sp, sval);
	  if ((d->info & CTF_UNION)) {
	    if (d->size != dc->size)  /* NYI: partial init of union. */
	      lj_trace_err(J, LJ_TRERR_NYICONV);
	    break;
	  }
	} else if (!ctype_isconstval(df->info)) {
	  /* NYI: init bitfields and sub-structures. */
	  lj_trace_err(J, LJ_TRERR_NYICONV);
	}
      }
    } else {
      TRef dp;
    single_init:
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (J->base[1]) {
	crec_ct_tv(J, d, dp, J->base[1], &rd->argv[1]);
      } else {
	TValue tv;
	tv.u64 = 0;
	crec_ct_tv(J, d, dp, lj_ir_kint(J, 0), &tv);
      }
    }
  }
  J->base[0] = trcd;
  /* Handle __gc metamethod. */
  fin = lj_ctype_meta(cts, id, MM_gc);
  if (fin)
    crec_finalizer(J, trcd, 0, fin);
}